

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_12x12(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int aiStack_1b8 [98];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar18 = 0; (int)lVar18 != 8; lVar18 = lVar18 + 1) {
    lVar7 = (long)*(short *)((long)pvVar4 + lVar18 * 2) * (long)coef_block[lVar18] * 0x2000;
    lVar10 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x40) * (long)coef_block[lVar18 + 0x20];
    lVar13 = lVar10 * 0x2731 + lVar7 + 0x400;
    lVar28 = lVar7 + 0x400 + lVar10 * -0x2731;
    lVar10 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x20) * (long)coef_block[lVar18 + 0x10];
    lVar21 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x60) * (long)coef_block[lVar18 + 0x30];
    lVar33 = (lVar10 - lVar21) * 0x2000 + lVar7 + 0x400;
    lVar34 = lVar7 + 0x400 + (lVar10 - lVar21) * -0x2000;
    lVar7 = lVar10 * 0x2bb6 + lVar21 * 0x2000;
    lVar14 = lVar13 + lVar7;
    lVar13 = lVar13 - lVar7;
    lVar10 = lVar10 * 0xbb6 + lVar21 * -0x2000;
    lVar7 = lVar10 + lVar28;
    lVar28 = lVar28 - lVar10;
    lVar15 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x10) * (long)coef_block[lVar18 + 8];
    lVar10 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x30) * (long)coef_block[lVar18 + 0x18];
    lVar16 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x50) * (long)coef_block[lVar18 + 0x28];
    lVar11 = (long)*(short *)((long)pvVar4 + lVar18 * 2 + 0x70) * (long)coef_block[lVar18 + 0x38];
    lVar26 = (lVar11 + lVar16 + lVar15) * 0x1b8d;
    lVar29 = (lVar16 + lVar15) * 0x85b + lVar26;
    lVar22 = lVar15 * 0x8f7 + lVar10 * 0x29cf + lVar29;
    lVar21 = (lVar11 + lVar16) * -0x2175;
    lVar29 = lVar16 * -0x2f50 + lVar10 * -0x1151 + lVar21 + lVar29;
    lVar30 = lVar11 * 0x32c6 + lVar10 * -0x29cf + lVar21 + lVar26;
    lVar26 = lVar11 * -0x3f74 + lVar15 * -0x15a4 + lVar10 * -0x1151 + lVar26;
    lVar21 = ((lVar10 - lVar16) + (lVar15 - lVar11)) * 0x1151;
    lVar11 = (lVar15 - lVar11) * 0x187e + lVar21;
    lVar21 = (lVar10 - lVar16) * -0x3b21 + lVar21;
    aiStack_1b8[lVar18] = (int)((ulong)(lVar22 + lVar14) >> 0xb);
    aiStack_1b8[lVar18 + 0x58] = (int)((ulong)(lVar14 - lVar22) >> 0xb);
    aiStack_1b8[lVar18 + 8] = (int)((ulong)(lVar11 + lVar33) >> 0xb);
    aiStack_1b8[lVar18 + 0x50] = (int)((ulong)(lVar33 - lVar11) >> 0xb);
    aiStack_1b8[lVar18 + 0x10] = (int)((ulong)(lVar7 + lVar29) >> 0xb);
    aiStack_1b8[lVar18 + 0x48] = (int)((ulong)(lVar7 - lVar29) >> 0xb);
    aiStack_1b8[lVar18 + 0x18] = (int)((ulong)(lVar30 + lVar28) >> 0xb);
    aiStack_1b8[lVar18 + 0x40] = (int)((ulong)(lVar28 - lVar30) >> 0xb);
    aiStack_1b8[lVar18 + 0x20] = (int)((ulong)(lVar21 + lVar34) >> 0xb);
    aiStack_1b8[lVar18 + 0x38] = (int)((ulong)(lVar34 - lVar21) >> 0xb);
    aiStack_1b8[lVar18 + 0x28] = (int)((ulong)(lVar26 + lVar13) >> 0xb);
    aiStack_1b8[lVar18 + 0x30] = (int)((ulong)(lVar13 - lVar26) >> 0xb);
  }
  uVar5 = (ulong)output_col;
  for (lVar18 = 0; lVar18 != 0x60; lVar18 = lVar18 + 8) {
    iVar9 = aiStack_1b8[lVar18 + 1];
    iVar23 = aiStack_1b8[lVar18] * 0x2000;
    iVar12 = iVar23 + aiStack_1b8[lVar18 + 4] * 0x2731 + 0x20000;
    iVar1 = aiStack_1b8[lVar18 + 2];
    iVar17 = aiStack_1b8[lVar18 + 6];
    iVar19 = (iVar1 - iVar17) * 0x2000 + iVar23 + 0x20000;
    iVar25 = iVar23 + 0x20000 + aiStack_1b8[lVar18 + 4] * -0x2731;
    iVar24 = iVar23 + 0x20000 + (iVar1 - iVar17) * -0x2000;
    iVar8 = iVar1 * 0x2bb6 + iVar17 * 0x2000;
    iVar23 = iVar8 + iVar12;
    iVar12 = iVar12 - iVar8;
    iVar17 = iVar1 * 0xbb6 + iVar17 * -0x2000;
    iVar1 = iVar17 + iVar25;
    iVar25 = iVar25 - iVar17;
    iVar17 = aiStack_1b8[lVar18 + 3];
    iVar8 = aiStack_1b8[lVar18 + 5];
    iVar2 = aiStack_1b8[lVar18 + 7];
    iVar20 = (iVar8 + iVar9 + iVar2) * 0x1b8d;
    iVar31 = (iVar8 + iVar9) * 0x85b + iVar20;
    iVar6 = iVar9 * 0x8f7 + iVar17 * 0x29cf + iVar31;
    iVar27 = (iVar2 + iVar8) * -0x2175;
    iVar31 = iVar8 * -0x2f50 + iVar17 * -0x1151 + iVar27 + iVar31;
    iVar32 = iVar2 * 0x32c6 + iVar17 * -0x29cf + iVar27 + iVar20;
    iVar20 = iVar2 * -0x3f74 + iVar9 * -0x15a4 + iVar17 * -0x1151 + iVar20;
    iVar27 = ((iVar9 - iVar2) + (iVar17 - iVar8)) * 0x1151;
    iVar9 = (iVar9 - iVar2) * 0x187e + iVar27;
    iVar27 = (iVar17 - iVar8) * -0x3b21 + iVar27;
    lVar7 = *(long *)((long)output_buf + lVar18);
    *(JSAMPLE *)(lVar7 + uVar5) = pJVar3[(ulong)((uint)(iVar6 + iVar23) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 0xb + uVar5) =
         pJVar3[(ulong)((uint)(iVar23 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 1 + uVar5) = pJVar3[(ulong)((uint)(iVar9 + iVar19) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar7 + 10 + uVar5) =
         pJVar3[(ulong)((uint)(iVar19 - iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 2 + uVar5) = pJVar3[(ulong)((uint)(iVar1 + iVar31) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar7 + 9 + uVar5) = pJVar3[(ulong)((uint)(iVar1 - iVar31) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar7 + 3 + uVar5) =
         pJVar3[(ulong)((uint)(iVar25 + iVar32) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 8 + uVar5) =
         pJVar3[(ulong)((uint)(iVar25 - iVar32) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 4 + uVar5) =
         pJVar3[(ulong)((uint)(iVar27 + iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 7 + uVar5) =
         pJVar3[(ulong)((uint)(iVar24 - iVar27) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 5 + uVar5) =
         pJVar3[(ulong)((uint)(iVar20 + iVar12) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 6 + uVar5) =
         pJVar3[(ulong)((uint)(iVar12 - iVar20) >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_12x12(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 12];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 12 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 12; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);

    z4 = (JLONG)wsptr[4];
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = (JLONG)wsptr[2];
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = (JLONG)wsptr[6];
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}